

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmxreftobin.cpp
# Opt level: O0

void fmxreftobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  undefined1 auStack_10 [4];
  fmXref q;
  
  fgets(local_1018,0x1000,_stdin);
  local_101c = 1;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d,%d,%d",line + 0xffc,auStack_10,&q);
    if (iVar1 != 3) break;
    fwrite(line + 0xffc,0xc,1,_stdout);
    local_101c = local_101c + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)local_101c,local_1018);
  return;
}

Assistant:

void doit() {

        fmXref q;
        char line[4096];
        int lineno = 0;
        fgets(line, sizeof(line), stdin);
        lineno++;
        while (fgets(line, sizeof(line), stdin) != 0) {
            if (sscanf(line, "%d,%d,%d", &q.output_id, &q.agg_id,
                       &q.layer_id) != 3) {
                fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
                return;
            } else {
                fwrite(&q, sizeof(q), 1, stdout);
            }
            lineno++;
        }
    }